

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O3

validator * __thiscall libchars::validation::get_validator_by_id(validation *this,id_t id)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  
  if ((id != 0) &&
     (p_Var2 = (this->i2v)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
     p_Var2 != (_Base_ptr)0x0)) {
    p_Var3 = &(this->i2v)._M_t._M_impl.super__Rb_tree_header;
    p_Var1 = &p_Var3->_M_header;
    do {
      if (id <= (int)p_Var2[1]._M_color) {
        p_Var1 = p_Var2;
      }
      p_Var2 = (&p_Var2->_M_left)[(int)p_Var2[1]._M_color < id];
    } while (p_Var2 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var1 == p_Var3) || (id < (int)p_Var1[1]._M_color)) {
      p_Var2 = (_Base_ptr)0x0;
    }
    else {
      p_Var2 = p_Var1[1]._M_parent;
    }
    return (validator *)p_Var2;
  }
  return (validator *)0x0;
}

Assistant:

const validator *validation::get_validator_by_id(validator::id_t id)
    {
        if (id == validator::NONE)
            return NULL;

        validators_by_id_t::const_iterator ii = i2v.find(id);
        if (ii != i2v.end())
            return ii->second;
        else
            return NULL;
    }